

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# render-data.cc
# Opt level: O0

bool tinyusdz::tydra::(anonymous_namespace)::TriangulatePolygon<std::array<float,3ul>,float>
               (vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_> *points,
               vector<unsigned_int,_std::allocator<unsigned_int>_> *faceVertexCounts,
               vector<unsigned_int,_std::allocator<unsigned_int>_> *faceVertexIndices,
               vector<unsigned_int,_std::allocator<unsigned_int>_> *triangulatedFaceVertexCounts,
               vector<unsigned_int,_std::allocator<unsigned_int>_> *triangulatedFaceVertexIndices,
               vector<unsigned_long,_std::allocator<unsigned_long>_>
               *triangulatedToOrigFaceVertexIndexMap,
               vector<unsigned_int,_std::allocator<unsigned_int>_> *triangulatedFaceCounts,
               string *err)

{
  float fVar1;
  float fVar2;
  size_t sVar3;
  size_t sVar4;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *pvVar5;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *pvVar6;
  int iVar7;
  size_type sVar8;
  const_reference pvVar9;
  ulong uVar10;
  const_reference pvVar11;
  reference pvVar12;
  const_reference pvVar13;
  reference pvVar14;
  reference pvVar15;
  vector<std::vector<std::array<float,_2UL>,_std::allocator<std::array<float,_2UL>_>_>,_std::allocator<std::vector<std::array<float,_2UL>,_std::allocator<std::array<float,_2UL>_>_>_>_>
  *poly;
  double dVar16;
  double dVar17;
  float3 fVar18;
  value_type_conflict3 local_3d4;
  value_type_conflict2 local_3d0;
  value_type_conflict2 local_3c8;
  value_type_conflict2 local_3c0;
  value_type_conflict3 local_3b4;
  ulong local_3b0;
  size_t k_2;
  size_t ntris;
  undefined1 local_398 [8];
  vector<unsigned_int,_std::allocator<unsigned_int>_> indices;
  vector<std::vector<std::array<float,_2UL>,_std::allocator<std::array<float,_2UL>_>_>,_std::allocator<std::vector<std::array<float,_2UL>,_std::allocator<std::array<float,_2UL>_>_>_>_>
  polygon_2d;
  undefined1 local_360 [8];
  Point3D loc;
  float3 v;
  size_t vidx;
  size_t k_1;
  vector<std::array<float,_2UL>,_std::allocator<std::array<float,_2UL>_>_> polyline;
  float local_318;
  float local_300 [2];
  float local_2f8;
  float local_2f0 [2];
  float local_2e8;
  float3 local_2e0;
  float local_2d0 [2];
  float local_2c8;
  undefined4 local_2c0;
  undefined4 uStack_2bc;
  undefined4 local_2b8;
  undefined4 local_2b4;
  undefined4 uStack_2b0;
  undefined4 local_2ac;
  undefined1 local_2a8 [8];
  array<float,_3UL> a;
  array<float,_3UL> axis_u;
  array<float,_3UL> axis_v;
  array<float,_3UL> axis_w;
  double length_n;
  float local_250;
  array<float,_3UL> b;
  array<float,_3UL> a_1;
  array<float,_3UL> point2;
  array<float,_3UL> point1;
  array<float,_3UL> v1;
  array<float,_3UL> v0;
  string local_1e8;
  allocator local_1c1;
  string local_1c0;
  string local_1a0;
  ulong local_180;
  size_t j;
  size_t k;
  size_t vi0_2;
  size_t vi0;
  double3 n;
  value_type_conflict2 local_140;
  value_type_conflict2 local_138;
  size_t local_130;
  value_type_conflict2 local_128;
  value_type_conflict2 local_120;
  size_t local_118;
  value_type_conflict3 local_10c [3];
  value_type_conflict2 local_100;
  value_type_conflict2 local_f8;
  size_t local_f0;
  value_type_conflict3 local_e8;
  allocator local_e1;
  string local_e0;
  string local_c0;
  allocator local_99;
  string local_98 [32];
  string local_78;
  uint local_54;
  undefined1 auStack_50 [4];
  uint32_t npolys;
  size_t i;
  size_t faceIndexOffset;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *triangulatedToOrigFaceVertexIndexMap_local;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *triangulatedFaceVertexIndices_local;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *triangulatedFaceVertexCounts_local;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *faceVertexIndices_local;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *faceVertexCounts_local;
  vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_> *points_local;
  
  faceIndexOffset = (size_t)triangulatedToOrigFaceVertexIndexMap;
  triangulatedToOrigFaceVertexIndexMap_local =
       (vector<unsigned_long,_std::allocator<unsigned_long>_> *)triangulatedFaceVertexIndices;
  triangulatedFaceVertexIndices_local = triangulatedFaceVertexCounts;
  triangulatedFaceVertexCounts_local = faceVertexIndices;
  faceVertexIndices_local = faceVertexCounts;
  faceVertexCounts_local = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)points;
  ::std::vector<unsigned_int,_std::allocator<unsigned_int>_>::clear(triangulatedFaceVertexCounts);
  ::std::vector<unsigned_int,_std::allocator<unsigned_int>_>::clear
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
             triangulatedToOrigFaceVertexIndexMap_local);
  ::std::vector<unsigned_long,_std::allocator<unsigned_long>_>::clear
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)faceIndexOffset);
  i = 0;
  _auStack_50 = 0;
  do {
    uVar10 = _auStack_50;
    sVar8 = ::std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size
                      (faceVertexIndices_local);
    if (sVar8 <= uVar10) {
      points_local._7_1_ = 1;
LAB_004b9a8c:
      return (bool)(points_local._7_1_ & 1);
    }
    pvVar9 = ::std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                       (faceVertexIndices_local,_auStack_50);
    local_54 = *pvVar9;
    if (local_54 < 3) {
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string
                (local_98,
                 "faceVertex count must be 3(triangle) or more(polygon), but got faceVertexCounts[{}] = {}\n"
                 ,&local_99);
      fmt::format<unsigned_long,unsigned_int>
                (&local_78,(fmt *)local_98,(string *)auStack_50,(unsigned_long *)&local_54,
                 (uint *)triangulatedFaceVertexIndices);
      ::std::__cxx11::string::operator=((string *)err,(string *)&local_78);
      ::std::__cxx11::string::~string((string *)&local_78);
      ::std::__cxx11::string::~string(local_98);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_99);
      points_local._7_1_ = 0;
      goto LAB_004b9a8c;
    }
    uVar10 = i + local_54;
    sVar8 = ::std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size
                      (triangulatedFaceVertexCounts_local);
    if (sVar8 < uVar10) {
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string
                ((string *)&local_e0,
                 "Invalid faceVertexIndices or faceVertexCounts. faceVertex index exceeds faceVertexIndices.size() at [{}]\n"
                 ,&local_e1);
      fmt::format<unsigned_long>(&local_c0,&local_e0,(unsigned_long *)auStack_50);
      ::std::__cxx11::string::operator=((string *)err,(string *)&local_c0);
      ::std::__cxx11::string::~string((string *)&local_c0);
      ::std::__cxx11::string::~string((string *)&local_e0);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_e1);
      points_local._7_1_ = 0;
      goto LAB_004b9a8c;
    }
    if (local_54 == 3) {
      local_e8 = 3;
      ::std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                (triangulatedFaceVertexIndices_local,&local_e8);
      pvVar5 = triangulatedToOrigFaceVertexIndexMap_local;
      pvVar9 = ::std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                         (triangulatedFaceVertexCounts_local,i);
      ::std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)pvVar5,pvVar9);
      pvVar5 = triangulatedToOrigFaceVertexIndexMap_local;
      pvVar9 = ::std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                         (triangulatedFaceVertexCounts_local,i + 1);
      ::std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)pvVar5,pvVar9);
      pvVar5 = triangulatedToOrigFaceVertexIndexMap_local;
      pvVar9 = ::std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                         (triangulatedFaceVertexCounts_local,i + 2);
      ::std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)pvVar5,pvVar9);
      local_f0 = i;
      ::std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)faceIndexOffset,&local_f0)
      ;
      local_f8 = i + 1;
      ::std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)faceIndexOffset,&local_f8)
      ;
      local_100 = i + 2;
      ::std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)faceIndexOffset,&local_100
                );
      local_10c[2] = 1;
      ::std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                (triangulatedFaceCounts,local_10c + 2);
    }
    else if (local_54 == 4) {
      local_10c[1] = 3;
      ::std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                (triangulatedFaceVertexIndices_local,local_10c + 1);
      local_10c[0] = 3;
      ::std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                (triangulatedFaceVertexIndices_local,local_10c);
      pvVar5 = triangulatedToOrigFaceVertexIndexMap_local;
      pvVar9 = ::std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                         (triangulatedFaceVertexCounts_local,i);
      ::std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)pvVar5,pvVar9);
      pvVar5 = triangulatedToOrigFaceVertexIndexMap_local;
      pvVar9 = ::std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                         (triangulatedFaceVertexCounts_local,i + 1);
      ::std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)pvVar5,pvVar9);
      pvVar5 = triangulatedToOrigFaceVertexIndexMap_local;
      pvVar9 = ::std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                         (triangulatedFaceVertexCounts_local,i + 2);
      ::std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)pvVar5,pvVar9);
      pvVar5 = triangulatedToOrigFaceVertexIndexMap_local;
      pvVar9 = ::std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                         (triangulatedFaceVertexCounts_local,i);
      ::std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)pvVar5,pvVar9);
      pvVar5 = triangulatedToOrigFaceVertexIndexMap_local;
      pvVar9 = ::std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                         (triangulatedFaceVertexCounts_local,i + 2);
      ::std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)pvVar5,pvVar9);
      pvVar5 = triangulatedToOrigFaceVertexIndexMap_local;
      pvVar9 = ::std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                         (triangulatedFaceVertexCounts_local,i + 3);
      ::std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)pvVar5,pvVar9);
      local_118 = i;
      ::std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)faceIndexOffset,&local_118
                );
      local_120 = i + 1;
      ::std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)faceIndexOffset,&local_120
                );
      local_128 = i + 2;
      ::std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)faceIndexOffset,&local_128
                );
      local_130 = i;
      ::std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)faceIndexOffset,&local_130
                );
      local_138 = i + 2;
      ::std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)faceIndexOffset,&local_138
                );
      local_140 = i + 3;
      ::std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)faceIndexOffset,&local_140
                );
      n._M_elems[2]._4_4_ = 2;
      ::std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                (triangulatedFaceCounts,(value_type_conflict3 *)((long)n._M_elems + 0x14));
    }
    else {
      memset(&vi0,0,0x18);
      for (j = 0; j < local_54; j = j + 1) {
        pvVar9 = ::std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                           (triangulatedFaceVertexCounts_local,i + j);
        vi0_2 = (size_t)*pvVar9;
        local_180 = (j + 1) % (ulong)local_54;
        pvVar9 = ::std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                           (triangulatedFaceVertexCounts_local,i + local_180);
        sVar4 = vi0_2;
        k = (size_t)*pvVar9;
        sVar8 = ::std::vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>::
                size((vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_> *)
                     faceVertexCounts_local);
        sVar3 = k;
        if (sVar8 <= sVar4) {
          ::std::allocator<char>::allocator();
          ::std::__cxx11::string::string((string *)&local_1c0,"Invalid vertex index.\n",&local_1c1);
          fmt::format(&local_1a0,&local_1c0);
          ::std::__cxx11::string::operator=((string *)err,(string *)&local_1a0);
          ::std::__cxx11::string::~string((string *)&local_1a0);
          ::std::__cxx11::string::~string((string *)&local_1c0);
          ::std::allocator<char>::~allocator((allocator<char> *)&local_1c1);
          points_local._7_1_ = 0;
          goto LAB_004b9a8c;
        }
        sVar8 = ::std::vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>::
                size((vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_> *)
                     faceVertexCounts_local);
        if (sVar8 <= sVar3) {
          ::std::allocator<char>::allocator();
          ::std::__cxx11::string::string
                    ((string *)(v0._M_elems + 2),"Invalid vertex index.\n",
                     (allocator *)((long)v0._M_elems + 7));
          fmt::format(&local_1e8,(string *)(v0._M_elems + 2));
          ::std::__cxx11::string::operator=((string *)err,(string *)&local_1e8);
          ::std::__cxx11::string::~string((string *)&local_1e8);
          ::std::__cxx11::string::~string((string *)(v0._M_elems + 2));
          ::std::allocator<char>::~allocator((allocator<char> *)((long)v0._M_elems + 7));
          points_local._7_1_ = 0;
          goto LAB_004b9a8c;
        }
        pvVar11 = ::std::vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>::
                  operator[]((vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>
                              *)faceVertexCounts_local,vi0_2);
        v1._M_elems._4_8_ = *(undefined8 *)pvVar11->_M_elems;
        v0._M_elems[0] = pvVar11->_M_elems[2];
        pvVar11 = ::std::vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>::
                  operator[]((vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>
                              *)faceVertexCounts_local,k);
        point1._M_elems._4_8_ = *(undefined8 *)pvVar11->_M_elems;
        v1._M_elems[0] = pvVar11->_M_elems[2];
        pvVar12 = ::std::array<float,_3UL>::operator[]((array<float,_3UL> *)(v1._M_elems + 1),0);
        point2._M_elems[1] = *pvVar12;
        pvVar12 = ::std::array<float,_3UL>::operator[]((array<float,_3UL> *)(v1._M_elems + 1),1);
        point2._M_elems[2] = *pvVar12;
        pvVar12 = ::std::array<float,_3UL>::operator[]((array<float,_3UL> *)(v1._M_elems + 1),2);
        point1._M_elems[0] = *pvVar12;
        pvVar12 = ::std::array<float,_3UL>::operator[]((array<float,_3UL> *)(point1._M_elems + 1),0)
        ;
        a_1._M_elems[1] = *pvVar12;
        pvVar12 = ::std::array<float,_3UL>::operator[]((array<float,_3UL> *)(point1._M_elems + 1),1)
        ;
        a_1._M_elems[2] = *pvVar12;
        pvVar12 = ::std::array<float,_3UL>::operator[]((array<float,_3UL> *)(point1._M_elems + 1),2)
        ;
        point2._M_elems[0] = *pvVar12;
        pvVar13 = ::std::array<float,_3UL>::operator[]((array<float,_3UL> *)(point2._M_elems + 1),0)
        ;
        fVar1 = *pvVar13;
        pvVar13 = ::std::array<float,_3UL>::operator[]((array<float,_3UL> *)(a_1._M_elems + 1),0);
        b._M_elems[1] = fVar1 - *pvVar13;
        pvVar13 = ::std::array<float,_3UL>::operator[]((array<float,_3UL> *)(point2._M_elems + 1),1)
        ;
        fVar1 = *pvVar13;
        pvVar13 = ::std::array<float,_3UL>::operator[]((array<float,_3UL> *)(a_1._M_elems + 1),1);
        b._M_elems[2] = fVar1 - *pvVar13;
        pvVar13 = ::std::array<float,_3UL>::operator[]((array<float,_3UL> *)(point2._M_elems + 1),2)
        ;
        fVar1 = *pvVar13;
        pvVar13 = ::std::array<float,_3UL>::operator[]((array<float,_3UL> *)(a_1._M_elems + 1),2);
        a_1._M_elems[0] = fVar1 - *pvVar13;
        pvVar13 = ::std::array<float,_3UL>::operator[]((array<float,_3UL> *)(point2._M_elems + 1),0)
        ;
        fVar1 = *pvVar13;
        pvVar13 = ::std::array<float,_3UL>::operator[]((array<float,_3UL> *)(a_1._M_elems + 1),0);
        length_n._4_4_ = fVar1 + *pvVar13;
        pvVar13 = ::std::array<float,_3UL>::operator[]((array<float,_3UL> *)(point2._M_elems + 1),1)
        ;
        fVar1 = *pvVar13;
        pvVar13 = ::std::array<float,_3UL>::operator[]((array<float,_3UL> *)(a_1._M_elems + 1),1);
        local_250 = fVar1 + *pvVar13;
        pvVar13 = ::std::array<float,_3UL>::operator[]((array<float,_3UL> *)(point2._M_elems + 1),2)
        ;
        fVar1 = *pvVar13;
        pvVar13 = ::std::array<float,_3UL>::operator[]((array<float,_3UL> *)(a_1._M_elems + 1),2);
        b._M_elems[0] = fVar1 + *pvVar13;
        pvVar12 = ::std::array<float,_3UL>::operator[]((array<float,_3UL> *)(b._M_elems + 1),1);
        fVar1 = *pvVar12;
        pvVar12 = ::std::array<float,_3UL>::operator[]((array<float,_3UL> *)((long)&length_n + 4),2)
        ;
        fVar2 = *pvVar12;
        pvVar14 = ::std::array<double,_3UL>::operator[]((array<double,_3UL> *)&vi0,0);
        *pvVar14 = (double)(fVar1 * fVar2) + *pvVar14;
        pvVar12 = ::std::array<float,_3UL>::operator[]((array<float,_3UL> *)(b._M_elems + 1),2);
        fVar1 = *pvVar12;
        pvVar12 = ::std::array<float,_3UL>::operator[]((array<float,_3UL> *)((long)&length_n + 4),0)
        ;
        fVar2 = *pvVar12;
        pvVar14 = ::std::array<double,_3UL>::operator[]((array<double,_3UL> *)&vi0,1);
        *pvVar14 = (double)(fVar1 * fVar2) + *pvVar14;
        pvVar12 = ::std::array<float,_3UL>::operator[]((array<float,_3UL> *)(b._M_elems + 1),0);
        fVar1 = *pvVar12;
        pvVar12 = ::std::array<float,_3UL>::operator[]((array<float,_3UL> *)((long)&length_n + 4),1)
        ;
        fVar2 = *pvVar12;
        pvVar14 = ::std::array<double,_3UL>::operator[]((array<double,_3UL> *)&vi0,2);
        *pvVar14 = (double)(fVar1 * fVar2) + *pvVar14;
      }
      dVar16 = vlength((double3 *)&vi0);
      dVar17 = ::std::numeric_limits<double>::epsilon();
      if (ABS(dVar16) < dVar17) {
        ::std::__cxx11::string::operator=((string *)err,"Degenerated polygon found.\n");
        points_local._7_1_ = 0;
        goto LAB_004b9a8c;
      }
      vnormalize((double3 *)(axis_w._M_elems + 1),(double3 *)&vi0,2.220446049250313e-16);
      vi0._0_4_ = axis_w._M_elems[1];
      vi0._4_4_ = axis_w._M_elems[2];
      pvVar14 = ::std::array<double,_3UL>::operator[]((array<double,_3UL> *)&vi0,0);
      dVar16 = *pvVar14;
      pvVar12 = ::std::array<float,_3UL>::operator[]((array<float,_3UL> *)(axis_v._M_elems + 1),0);
      *pvVar12 = (float)dVar16;
      pvVar14 = ::std::array<double,_3UL>::operator[]((array<double,_3UL> *)&vi0,1);
      dVar16 = *pvVar14;
      pvVar12 = ::std::array<float,_3UL>::operator[]((array<float,_3UL> *)(axis_v._M_elems + 1),1);
      *pvVar12 = (float)dVar16;
      pvVar14 = ::std::array<double,_3UL>::operator[]((array<double,_3UL> *)&vi0,2);
      dVar16 = *pvVar14;
      pvVar12 = ::std::array<float,_3UL>::operator[]((array<float,_3UL> *)(axis_v._M_elems + 1),2);
      *pvVar12 = (float)dVar16;
      pvVar12 = ::std::array<float,_3UL>::operator[]((array<float,_3UL> *)(axis_v._M_elems + 1),0);
      dVar16 = ::std::fabs((double)(ulong)(uint)*pvVar12);
      if (SUB84(dVar16,0) <= 0.9999999) {
        local_2c0 = 0x3f800000;
        uStack_2bc = 0;
        local_2b8 = 0;
        local_2a8._0_4_ = 1.0;
        local_2a8._4_4_ = 0.0;
      }
      else {
        local_2b4 = 0;
        uStack_2b0 = 0x3f800000;
        local_2ac = 0;
        local_2a8._0_4_ = 0.0;
        local_2a8._4_4_ = 1.0;
      }
      a._M_elems[0] = 0.0;
      fVar18 = vcross((float3 *)(axis_v._M_elems + 1),(float3 *)local_2a8);
      local_2e8 = fVar18._M_elems[2];
      local_2e0._M_elems[2] = local_2e8;
      local_2f0 = fVar18._M_elems._0_8_;
      local_2e0._M_elems[0] = local_2f0[0];
      local_2e0._M_elems[1] = local_2f0[1];
      fVar18 = vnormalize(&local_2e0,1.1920929e-07);
      local_2f8 = fVar18._M_elems[2];
      local_2c8 = local_2f8;
      local_300 = fVar18._M_elems._0_8_;
      local_2d0[0] = local_300[0];
      local_2d0[1] = local_300[1];
      axis_v._M_elems[0] = local_2f8;
      axis_u._M_elems[1] = local_300[0];
      axis_u._M_elems[2] = local_300[1];
      join_0x00001240_0x00001200_ =
           vcross((float3 *)(axis_v._M_elems + 1),(float3 *)(axis_u._M_elems + 1));
      a._M_elems._4_8_ =
           polyline.
           super__Vector_base<std::array<float,_2UL>,_std::allocator<std::array<float,_2UL>_>_>.
           _M_impl.super__Vector_impl_data._M_end_of_storage;
      axis_u._M_elems[0] = local_318;
      ::std::vector<std::array<float,_2UL>,_std::allocator<std::array<float,_2UL>_>_>::vector
                ((vector<std::array<float,_2UL>,_std::allocator<std::array<float,_2UL>_>_> *)&k_1);
      for (vidx = 0; vidx < local_54; vidx = vidx + 1) {
        pvVar9 = ::std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                           (triangulatedFaceVertexCounts_local,i + vidx);
        pvVar11 = ::std::vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>::
                  operator[]((vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>
                              *)faceVertexCounts_local,(ulong)*pvVar9);
        loc._M_elems._4_8_ = *(undefined8 *)pvVar11->_M_elems;
        local_360._0_4_ = vdot((float3 *)(loc._M_elems + 1),(float3 *)(a._M_elems + 1));
        local_360._4_4_ = vdot((float3 *)(loc._M_elems + 1),(float3 *)(axis_u._M_elems + 1));
        loc._M_elems[0] = vdot((float3 *)(loc._M_elems + 1),(float3 *)(axis_v._M_elems + 1));
        pvVar12 = ::std::array<float,_3UL>::operator[]((array<float,_3UL> *)local_360,0);
        polygon_2d.
        super__Vector_base<std::vector<std::array<float,_2UL>,_std::allocator<std::array<float,_2UL>_>_>,_std::allocator<std::vector<std::array<float,_2UL>,_std::allocator<std::array<float,_2UL>_>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = *pvVar12;
        pvVar12 = ::std::array<float,_3UL>::operator[]((array<float,_3UL> *)local_360,1);
        polygon_2d.
        super__Vector_base<std::vector<std::array<float,_2UL>,_std::allocator<std::array<float,_2UL>_>_>,_std::allocator<std::vector<std::array<float,_2UL>,_std::allocator<std::array<float,_2UL>_>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = *pvVar12;
        ::std::vector<std::array<float,_2UL>,_std::allocator<std::array<float,_2UL>_>_>::push_back
                  ((vector<std::array<float,_2UL>,_std::allocator<std::array<float,_2UL>_>_> *)&k_1,
                   (value_type *)
                   &polygon_2d.
                    super__Vector_base<std::vector<std::array<float,_2UL>,_std::allocator<std::array<float,_2UL>_>_>,_std::allocator<std::vector<std::array<float,_2UL>,_std::allocator<std::array<float,_2UL>_>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage);
      }
      ::std::
      vector<std::vector<std::array<float,_2UL>,_std::allocator<std::array<float,_2UL>_>_>,_std::allocator<std::vector<std::array<float,_2UL>,_std::allocator<std::array<float,_2UL>_>_>_>_>
      ::vector((vector<std::vector<std::array<float,_2UL>,_std::allocator<std::array<float,_2UL>_>_>,_std::allocator<std::vector<std::array<float,_2UL>,_std::allocator<std::array<float,_2UL>_>_>_>_>
                *)&indices.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage);
      mapbox::
      earcut<unsigned_int,std::vector<std::vector<std::array<float,2ul>,std::allocator<std::array<float,2ul>>>,std::allocator<std::vector<std::array<float,2ul>,std::allocator<std::array<float,2ul>>>>>>
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_398,
                 (mapbox *)
                 &indices.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage,poly);
      sVar8 = ::std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size
                        ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_398);
      if (sVar8 % 3 == 0) {
        sVar8 = ::std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size
                          ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_398);
        k_2 = sVar8 / 3;
        iVar7 = ::std::numeric_limits<int>::max();
        if ((ulong)(long)iVar7 < sVar8 / 3) {
          ::std::__cxx11::string::operator=((string *)err,"Too many triangles are generated.\n");
          points_local._7_1_ = 0;
          ntris._4_4_ = 1;
        }
        else {
          for (local_3b0 = 0; local_3b0 < k_2; local_3b0 = local_3b0 + 1) {
            local_3b4 = 3;
            ::std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                      (triangulatedFaceVertexIndices_local,&local_3b4);
            pvVar6 = triangulatedFaceVertexCounts_local;
            pvVar5 = triangulatedToOrigFaceVertexIndexMap_local;
            sVar3 = i;
            pvVar15 = ::std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_398,
                                 local_3b0 * 3);
            pvVar9 = ::std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                               (pvVar6,sVar3 + *pvVar15);
            ::std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                      ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)pvVar5,pvVar9);
            pvVar6 = triangulatedFaceVertexCounts_local;
            pvVar5 = triangulatedToOrigFaceVertexIndexMap_local;
            sVar3 = i;
            pvVar15 = ::std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_398,
                                 local_3b0 * 3 + 1);
            pvVar9 = ::std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                               (pvVar6,sVar3 + *pvVar15);
            ::std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                      ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)pvVar5,pvVar9);
            pvVar6 = triangulatedFaceVertexCounts_local;
            pvVar5 = triangulatedToOrigFaceVertexIndexMap_local;
            sVar3 = i;
            pvVar15 = ::std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_398,
                                 local_3b0 * 3 + 2);
            pvVar9 = ::std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                               (pvVar6,sVar3 + *pvVar15);
            ::std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                      ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)pvVar5,pvVar9);
            sVar4 = faceIndexOffset;
            sVar3 = i;
            pvVar15 = ::std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_398,
                                 local_3b0 * 3);
            local_3c0 = sVar3 + *pvVar15;
            ::std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
                      ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)sVar4,&local_3c0);
            sVar4 = faceIndexOffset;
            sVar3 = i;
            pvVar15 = ::std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_398,
                                 local_3b0 * 3 + 1);
            local_3c8 = sVar3 + *pvVar15;
            ::std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
                      ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)sVar4,&local_3c8);
            sVar4 = faceIndexOffset;
            sVar3 = i;
            pvVar15 = ::std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_398,
                                 local_3b0 * 3 + 2);
            local_3d0 = sVar3 + *pvVar15;
            ::std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
                      ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)sVar4,&local_3d0);
          }
          local_3d4 = (value_type_conflict3)k_2;
          ::std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                    (triangulatedFaceCounts,&local_3d4);
          ntris._4_4_ = 0;
        }
      }
      else {
        ::std::__cxx11::string::operator=((string *)err,"Failed to triangulate.\n");
        points_local._7_1_ = 0;
        ntris._4_4_ = 1;
      }
      ::std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_398);
      ::std::
      vector<std::vector<std::array<float,_2UL>,_std::allocator<std::array<float,_2UL>_>_>,_std::allocator<std::vector<std::array<float,_2UL>,_std::allocator<std::array<float,_2UL>_>_>_>_>
      ::~vector((vector<std::vector<std::array<float,_2UL>,_std::allocator<std::array<float,_2UL>_>_>,_std::allocator<std::vector<std::array<float,_2UL>,_std::allocator<std::array<float,_2UL>_>_>_>_>
                 *)&indices.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage);
      ::std::vector<std::array<float,_2UL>,_std::allocator<std::array<float,_2UL>_>_>::~vector
                ((vector<std::array<float,_2UL>,_std::allocator<std::array<float,_2UL>_>_> *)&k_1);
      if (ntris._4_4_ != 0) goto LAB_004b9a8c;
    }
    i = local_54 + i;
    _auStack_50 = _auStack_50 + 1;
  } while( true );
}

Assistant:

bool TriangulatePolygon(
    const std::vector<T> &points, const std::vector<uint32_t> &faceVertexCounts,
    const std::vector<uint32_t> &faceVertexIndices,
    std::vector<uint32_t> &triangulatedFaceVertexCounts,
    std::vector<uint32_t> &triangulatedFaceVertexIndices,
    std::vector<size_t> &triangulatedToOrigFaceVertexIndexMap,
    std::vector<uint32_t> &triangulatedFaceCounts, std::string &err) {
  triangulatedFaceVertexCounts.clear();
  triangulatedFaceVertexIndices.clear();

  triangulatedToOrigFaceVertexIndexMap.clear();

  size_t faceIndexOffset = 0;

  // For each polygon(face)
  for (size_t i = 0; i < faceVertexCounts.size(); i++) {
    uint32_t npolys = faceVertexCounts[i];

    if (npolys < 3) {
      err = fmt::format(
          "faceVertex count must be 3(triangle) or "
          "more(polygon), but got faceVertexCounts[{}] = {}\n",
          i, npolys);
      return false;
    }

    if (faceIndexOffset + npolys > faceVertexIndices.size()) {
      err = fmt::format(
          "Invalid faceVertexIndices or faceVertexCounts. faceVertex index "
          "exceeds faceVertexIndices.size() at [{}]\n",
          i);
      return false;
    }

    if (npolys == 3) {
      // No need for triangulation.
      triangulatedFaceVertexCounts.push_back(3);
      triangulatedFaceVertexIndices.push_back(
          faceVertexIndices[faceIndexOffset + 0]);
      triangulatedFaceVertexIndices.push_back(
          faceVertexIndices[faceIndexOffset + 1]);
      triangulatedFaceVertexIndices.push_back(
          faceVertexIndices[faceIndexOffset + 2]);
      triangulatedToOrigFaceVertexIndexMap.push_back(faceIndexOffset + 0);
      triangulatedToOrigFaceVertexIndexMap.push_back(faceIndexOffset + 1);
      triangulatedToOrigFaceVertexIndexMap.push_back(faceIndexOffset + 2);
      triangulatedFaceCounts.push_back(1);
#if 1
    } else if (npolys == 4) {
      // Use simple split
      // TODO: Split at shortest edge for better triangulation.
      triangulatedFaceVertexCounts.push_back(3);
      triangulatedFaceVertexCounts.push_back(3);

      triangulatedFaceVertexIndices.push_back(
          faceVertexIndices[faceIndexOffset + 0]);
      triangulatedFaceVertexIndices.push_back(
          faceVertexIndices[faceIndexOffset + 1]);
      triangulatedFaceVertexIndices.push_back(
          faceVertexIndices[faceIndexOffset + 2]);

      triangulatedFaceVertexIndices.push_back(
          faceVertexIndices[faceIndexOffset + 0]);
      triangulatedFaceVertexIndices.push_back(
          faceVertexIndices[faceIndexOffset + 2]);
      triangulatedFaceVertexIndices.push_back(
          faceVertexIndices[faceIndexOffset + 3]);

      triangulatedToOrigFaceVertexIndexMap.push_back(faceIndexOffset + 0);
      triangulatedToOrigFaceVertexIndexMap.push_back(faceIndexOffset + 1);
      triangulatedToOrigFaceVertexIndexMap.push_back(faceIndexOffset + 2);
      triangulatedToOrigFaceVertexIndexMap.push_back(faceIndexOffset + 0);
      triangulatedToOrigFaceVertexIndexMap.push_back(faceIndexOffset + 2);
      triangulatedToOrigFaceVertexIndexMap.push_back(faceIndexOffset + 3);
      triangulatedFaceCounts.push_back(2);
#endif
    } else {
      // Use double for accuracy. `float` precision may classify small-are polygon as degenerated.
      // Find the normal axis of the polygon using Newell's method
      value::double3 n = {0, 0, 0};

      size_t vi0;
      size_t vi0_2;

      for (size_t k = 0; k < npolys; ++k) {
        vi0 = faceVertexIndices[faceIndexOffset + k];

        size_t j = (k + 1) % npolys;
        vi0_2 = faceVertexIndices[faceIndexOffset + j];

        if (vi0 >= points.size()) {
          err = fmt::format("Invalid vertex index.\n");
          return false;
        }

        if (vi0_2 >= points.size()) {
          err = fmt::format("Invalid vertex index.\n");
          return false;
        }

        T v0 = points[vi0];
        T v1 = points[vi0_2];

        const T point1 = {v0[0], v0[1], v0[2]};
        const T point2 = {v1[0], v1[1], v1[2]};

        T a = {point1[0] - point2[0], point1[1] - point2[1],
               point1[2] - point2[2]};
        T b = {point1[0] + point2[0], point1[1] + point2[1],
               point1[2] + point2[2]};

        n[0] += double(a[1] * b[2]);
        n[1] += double(a[2] * b[0]);
        n[2] += double(a[0] * b[1]);
        DCOUT("v0 " << v0);
        DCOUT("v1 " << v1);
        DCOUT("n " << n);
      }
      //BaseTy length_n = vlength(n);
      double length_n = vlength(n);

      // Check if zero length normal
      if (std::fabs(length_n) < std::numeric_limits<double>::epsilon()) {
        DCOUT("length_n " << length_n);
        err = "Degenerated polygon found.\n";
        return false;
      }

      // Negative is to flip the normal to the correct direction
      n = vnormalize(n);

      T axis_w, axis_v, axis_u;
      axis_w[0] = BaseTy(n[0]);
      axis_w[1] = BaseTy(n[1]);
      axis_w[2] = BaseTy(n[2]);
      T a;
      if (std::fabs(axis_w[0]) > BaseTy(0.9999999)) {  // TODO: use 1.0 - eps?
        a = {BaseTy(0), BaseTy(1), BaseTy(0)};
      } else {
        a = {BaseTy(1), BaseTy(0), BaseTy(0)};
      }
      axis_v = vnormalize(vcross(axis_w, a));
      axis_u = vcross(axis_w, axis_v);

      using Point3D = std::array<BaseTy, 3>;
      using Point2D = std::array<BaseTy, 2>;
      std::vector<Point2D> polyline;

      // TMW change: Find best normal and project v0x and v0y to those
      // coordinates, instead of picking a plane aligned with an axis (which
      // can flip polygons).

      // Fill polygon data.
      for (size_t k = 0; k < npolys; k++) {
        size_t vidx = faceVertexIndices[faceIndexOffset + k];

        value::float3 v = points[vidx];
        // Point3 polypoint = {v0[0],v0[1],v0[2]};

        // world to local
        Point3D loc = {vdot(v, axis_u), vdot(v, axis_v), vdot(v, axis_w)};

        polyline.push_back({loc[0], loc[1]});
      }

      std::vector<std::vector<Point2D>> polygon_2d;
      // Single polygon only(no holes)

      std::vector<uint32_t> indices = mapbox::earcut<uint32_t>(polygon_2d);
      //  => result = 3 * faces, clockwise

      if ((indices.size() % 3) != 0) {
        // This should not be happen, though.
        err = "Failed to triangulate.\n";
        return false;
      }

      size_t ntris = indices.size() / 3;

      // Up to 2GB tris.
      if (ntris > size_t((std::numeric_limits<int32_t>::max)())) {
        err = "Too many triangles are generated.\n";
        return false;
      }

      for (size_t k = 0; k < ntris; k++) {
        triangulatedFaceVertexCounts.push_back(3);
        triangulatedFaceVertexIndices.push_back(
            faceVertexIndices[faceIndexOffset + indices[3 * k + 0]]);
        triangulatedFaceVertexIndices.push_back(
            faceVertexIndices[faceIndexOffset + indices[3 * k + 1]]);
        triangulatedFaceVertexIndices.push_back(
            faceVertexIndices[faceIndexOffset + indices[3 * k + 2]]);

        triangulatedToOrigFaceVertexIndexMap.push_back(faceIndexOffset +
                                                       indices[3 * k + 0]);
        triangulatedToOrigFaceVertexIndexMap.push_back(faceIndexOffset +
                                                       indices[3 * k + 1]);
        triangulatedToOrigFaceVertexIndexMap.push_back(faceIndexOffset +
                                                       indices[3 * k + 2]);
      }
      triangulatedFaceCounts.push_back(uint32_t(ntris));
    }

    faceIndexOffset += npolys;
  }

  return true;
}